

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseProperty(char *in,char *end,Property **prop)

{
  byte bVar1;
  pointer names_00;
  pointer ppNVar2;
  byte *pbVar3;
  char *pcVar4;
  Reference *this;
  Property *this_00;
  ulong uVar5;
  byte *pbVar6;
  Text *pTVar7;
  char *tmp;
  byte *pbVar8;
  bool bVar9;
  bool bVar10;
  Text *id;
  Value *primData;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Text *local_58;
  Value *local_50;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> local_48;
  
  *prop = (Property *)0x0;
  if (in == end || in == (char *)0x0) {
    return in;
  }
  do {
    pbVar3 = (byte *)in;
    if ((0x2c < (ulong)(byte)*in) || ((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0))
    break;
    in = (char *)((byte *)in + 1);
    pbVar3 = (byte *)end;
  } while (in != end);
  local_58 = (Text *)0x0;
  pbVar3 = (byte *)parseIdentifier((char *)pbVar3,end,&local_58);
  pTVar7 = local_58;
  pbVar8 = pbVar3;
  if (local_58 == (Text *)0x0) {
    return (char *)pbVar3;
  }
  while (((pbVar3 != (byte *)end && (pbVar8 = pbVar3, (ulong)*pbVar3 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
    pbVar3 = pbVar3 + 1;
    pbVar8 = (byte *)end;
  }
  if (*pbVar8 != 0x3d) {
    Text::~Text(local_58);
    uVar5 = 0x18;
    goto LAB_0068be96;
  }
  pbVar8 = pbVar8 + 1;
  pbVar3 = pbVar8;
  pbVar6 = pbVar8;
  while (((pbVar3 != (byte *)end && (pbVar6 = pbVar3, (ulong)*pbVar3 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
    pbVar3 = pbVar3 + 1;
    pbVar6 = (byte *)end;
  }
  pbVar6 = pbVar6 + (pbVar6 == pbVar8);
  local_50 = (Value *)0x0;
  pbVar3 = pbVar6;
  if (pbVar6 != (byte *)end) {
    pbVar3 = pbVar6 + (*pbVar6 == 0x2d);
  }
  bVar10 = false;
  do {
    bVar9 = bVar10;
    bVar1 = *pbVar3;
    if ((((ulong)bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((bVar1 == 0x7d || ((pbVar3 == (byte *)end || (bVar1 == 0x29)))))) break;
    pbVar3 = pbVar3 + 1;
    bVar9 = (byte)(bVar1 - 0x30) < 10;
    bVar10 = true;
  } while (bVar9);
  if (bVar9) {
    pcVar4 = parseIntegerLiteral((char *)pbVar6,end,&local_50,ddl_int32);
    goto LAB_0068bf79;
  }
  pbVar3 = pbVar6;
  if (pbVar6 != (byte *)end) {
    pbVar3 = pbVar6 + (*pbVar6 == 0x2d);
  }
  bVar10 = false;
  while( true ) {
    bVar1 = *pbVar3;
    if (((((ulong)bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
        (bVar1 == 0x7d)) || ((pbVar3 == (byte *)end || (bVar1 == 0x29)))) break;
    if (bVar1 == 0x2e) {
      bVar10 = true;
      break;
    }
    if (9 < (byte)(bVar1 - 0x30)) goto LAB_0068bf64;
    pbVar3 = pbVar3 + 1;
    bVar10 = true;
  }
  if (bVar1 == 0x2e) goto LAB_0068bf17;
  goto LAB_0068bf64;
  while (bVar10 = (byte)(bVar1 - 0x30) < 10, bVar10) {
LAB_0068bf17:
    pbVar3 = pbVar3 + 1;
    bVar1 = *pbVar3;
    if ((((ulong)bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((bVar1 == 0x7d || ((pbVar3 == (byte *)end || (bVar1 == 0x29)))))) {
      if (bVar10) {
        pcVar4 = parseFloatingLiteral((char *)pbVar6,end,&local_50,ddl_float);
        goto LAB_0068bf79;
      }
      break;
    }
  }
LAB_0068bf64:
  if (*pbVar6 == 0x22) {
    pcVar4 = parseStringLiteral((char *)pbVar6,end,&local_50);
LAB_0068bf79:
    createPropertyWithData(local_58,local_50,prop);
    return pcVar4;
  }
  local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar8 = (byte *)parseReference((char *)pbVar6,end,&local_48);
  ppNVar2 = local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  names_00 = local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = (Reference *)operator_new(0x10);
    Reference::Reference(this,(long)ppNVar2 - (long)names_00 >> 3,names_00);
    this_00 = (Property *)operator_new(0x20);
    Property::Property(this_00,local_58);
    *prop = this_00;
    this_00->m_ref = this;
  }
  if ((Text *)local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_start == (Text *)0x0) {
    return (char *)pbVar8;
  }
  uVar5 = (long)local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage -
          (long)local_48.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pTVar7 = (Text *)local_48.
                   super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
LAB_0068be96:
  operator_delete(pTVar7,uVar5);
  return (char *)pbVar8;
}

Assistant:

char *OpenDDLParser::parseProperty( char *in, char *end, Property **prop ) {
    *prop = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    Text *id( ddl_nullptr );
    in = parseIdentifier( in, end, &id );
    if( ddl_nullptr != id ) {
        in = lookForNextToken( in, end );
        if( *in == '=' ) {
            ++in;
            in = getNextToken( in, end );
            Value *primData( ddl_nullptr );
            if( isInteger( in, end ) ) {
                in = parseIntegerLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else if( isFloat( in, end ) ) {
                in = parseFloatingLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else if( isStringLiteral( *in ) ) { // string data
                in = parseStringLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else {                              // reference data
                std::vector<Name*> names;
                in = parseReference( in, end, names );
                if( !names.empty() ) {
                    Reference *ref = new Reference( names.size(), &names[ 0 ] );
                    ( *prop ) = new Property( id );
                    ( *prop )->m_ref = ref;
                }
            }
        } else {
            delete id;
        }
    }

    return in;
}